

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

CVmTimeZone * CVmObjDate::get_tz_arg(uint argn,uint argc)

{
  vm_val_t *argp;
  vm_datatype_t vVar1;
  vm_val_t *pvVar2;
  int iVar3;
  CVmTimeZone *pCVar4;
  
  pvVar2 = sp_;
  if (argc != argn) {
    argp = sp_ + (-1 - (ulong)argn);
    vVar1 = argp->typ;
    if (vVar1 != VM_NIL) {
      if ((argn <= argc && argc - argn != 0) && (vVar1 == VM_OBJ)) {
        iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-1 - (ulong)argn].val.obj >> 0xc]
                                       [sp_[-1 - (ulong)argn].val.obj & 0xfff].ptr_ + 8))
                          (G_obj_table_X.pages_[sp_[-1 - (ulong)argn].val.obj >> 0xc] +
                           (sp_[-1 - (ulong)argn].val.obj & 0xfff),CVmObjTimeZone::metaclass_reg_);
        if (iVar3 != 0) {
          if (G_obj_table_X.pages_[pvVar2[-1 - (ulong)argn].val.obj >> 0xc] !=
              (CVmObjPageEntry *)0x0) {
            return (CVmTimeZone *)
                   **(undefined8 **)
                     ((long)&G_obj_table_X.pages_[pvVar2[-1 - (ulong)argn].val.obj >> 0xc]
                             [pvVar2[-1 - (ulong)argn].val.obj & 0xfff].ptr_ + 8);
          }
        }
      }
      pCVar4 = CVmObjTimeZone::parse_ctor_args(argp,argc - argn);
      return pCVar4;
    }
  }
  pCVar4 = CVmTimeZoneCache::get_local_zone(G_tzcache_X);
  return pCVar4;
}

Assistant:

CVmTimeZone *CVmObjDate::get_tz_arg(VMG_ uint argn, uint argc)
{
    /* if the argument is nil or missing, use the default local zone */
    vm_val_t *argp = G_stk->get(argn);
    if (argn == argc || argp->typ == VM_NIL)
        return G_tzcache->get_local_zone(vmg0_);

    /* check for a TimeZone object */
    CVmObjTimeZone *tzobj;
    if (argn < argc && (tzobj = vm_val_cast(CVmObjTimeZone, argp)) != 0)
        return tzobj->get_tz();

    /* otherwise, accept anything that the TimeZone constructor accepts */
    return CVmObjTimeZone::parse_ctor_args(vmg_ argp, argc - argn);
}